

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::~ReflectionClassGenerator
          (ReflectionClassGenerator *this)

{
  pointer pcVar1;
  
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__ReflectionClassGenerator_004cfb18;
  pcVar1 = (this->extensionClassname_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->extensionClassname_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->reflectionClassname_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->reflectionClassname_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->namespace_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->namespace_).field_2) {
    operator_delete(pcVar1);
  }
  SourceGeneratorBase::~SourceGeneratorBase(&this->super_SourceGeneratorBase);
  return;
}

Assistant:

ReflectionClassGenerator::~ReflectionClassGenerator() {
}